

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,String *decoded)

{
  bool bVar1;
  Location pCVar2;
  uint cp;
  allocator<char> local_c1;
  String local_c0;
  String local_a0;
  uint local_7c;
  Char local_75;
  uint unicode;
  Char escape;
  allocator<char> local_61;
  String local_60;
  char local_39;
  Location pCStack_38;
  Char c;
  Location end;
  Location current;
  String *decoded_local;
  Token *token_local;
  Reader *this_local;
  
  current = (Location)decoded;
  decoded_local = (String *)token;
  token_local = (Token *)this;
  std::__cxx11::string::reserve((ulong)decoded);
  end = (Location)(decoded_local->_M_string_length + 1);
  pCStack_38 = (Location)((decoded_local->field_2)._M_allocated_capacity - 1);
  while (end != pCStack_38) {
    pCVar2 = end + 1;
    local_39 = *end;
    if (local_39 == '\"') break;
    if (local_39 == '\\') {
      if (pCVar2 == pCStack_38) {
        end = pCVar2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"Empty escape sequence in string",&local_61);
        this_local._7_1_ = addError(this,&local_60,(Token *)decoded_local,end);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        goto LAB_010d7d08;
      }
      end = end + 2;
      local_75 = *pCVar2;
      switch(local_75) {
      case '\"':
        std::__cxx11::string::operator+=((string *)current,'\"');
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Bad escape sequence in string",&local_c1);
        this_local._7_1_ = addError(this,&local_c0,(Token *)decoded_local,end);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        goto LAB_010d7d08;
      case '/':
        std::__cxx11::string::operator+=((string *)current,'/');
        break;
      case '\\':
        std::__cxx11::string::operator+=((string *)current,'\\');
        break;
      case 'b':
        std::__cxx11::string::operator+=((string *)current,'\b');
        break;
      case 'f':
        std::__cxx11::string::operator+=((string *)current,'\f');
        break;
      case 'n':
        std::__cxx11::string::operator+=((string *)current,'\n');
        break;
      case 'r':
        std::__cxx11::string::operator+=((string *)current,'\r');
        break;
      case 't':
        std::__cxx11::string::operator+=((string *)current,'\t');
        break;
      case 'u':
        bVar1 = decodeUnicodeCodePoint(this,(Token *)decoded_local,&end,pCStack_38,&local_7c);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_010d7d08;
        }
        codePointToUTF8_abi_cxx11_(&local_a0,(Json *)(ulong)local_7c,cp);
        std::__cxx11::string::operator+=((string *)current,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
    else {
      end = pCVar2;
      std::__cxx11::string::operator+=((string *)current,local_39);
    }
  }
  this_local._7_1_ = 1;
LAB_010d7d08:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::decodeString(Token& token, String& decoded) {
  decoded.reserve(static_cast<size_t>(token.end_ - token.start_ - 2));
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}